

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdevicediscovery_udev_p.cpp
# Opt level: O3

int __thiscall
QDeviceDiscoveryUDev::qt_metacall(QDeviceDiscoveryUDev *this,Call _c,int _id,void **_a)

{
  int iVar1;
  QDeviceDiscoveryUDev *_t;
  
  iVar1 = QDeviceDiscovery::qt_metacall((QDeviceDiscovery *)this,_c,_id,_a);
  if (-1 < iVar1) {
    if (_c == RegisterMethodArgumentMetaType) {
      if (iVar1 == 0) {
        *(undefined8 *)*_a = 0;
      }
    }
    else {
      if (_c != InvokeMetaMethod) {
        return iVar1;
      }
      if (iVar1 == 0) {
        handleUDevNotification(this);
      }
    }
    iVar1 = iVar1 + -1;
  }
  return iVar1;
}

Assistant:

int QDeviceDiscoveryUDev::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QDeviceDiscovery::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 1)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 1)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 1;
    }
    return _id;
}